

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_get_arg_target(command_conflict *cmd,char *arg,int *target)

{
  wchar_t wVar1;
  cmd_arg_data_conflict data;
  
  wVar1 = cmd_get_arg(cmd,arg,arg_TARGET,&data);
  if (wVar1 == L'\0') {
    *target = data.choice;
  }
  return wVar1;
}

Assistant:

int cmd_get_arg_target(struct command *cmd, const char *arg, int *target)
{
	union cmd_arg_data data;
	int err;

	if ((err = cmd_get_arg(cmd, arg, arg_TARGET, &data)) == CMD_OK)
		*target = data.direction;

	return err;
}